

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

void unitize2d(double x,double y,double *ux,double *uy)

{
  undefined8 local_48;
  double d;
  double c;
  double s;
  double eps;
  double *uy_local;
  double *ux_local;
  double y_local;
  double x_local;
  
  c = y;
  if ((y != 0.0) || (NAN(y))) {
    if (ABS(y) <= ABS(x)) {
      local_48 = sqrt((y / x) * (y / x) + 1.0);
      local_48 = ABS(x) * local_48;
    }
    else {
      local_48 = sqrt((x / y) * (x / y) + 1.0);
      local_48 = ABS(y) * local_48;
    }
    local_48 = 1.0 / local_48;
    d = x;
    if (2.98023223877e-08 < ABS(local_48 - 1.0)) {
      c = local_48 * y;
      d = local_48 * x;
    }
    if ((ABS(c) <= 2.98023223877e-08) || (0.9999999701976776 <= ABS(d))) {
      c = 0.0;
      d = (double)(~-(ulong)(d < 0.0) & 0x3ff0000000000000 | -(ulong)(d < 0.0) & 0xbff0000000000000)
      ;
    }
    else if ((ABS(d) < 2.98023223877e-08) || (0.9999999701976776 <= ABS(c))) {
      d = 0.0;
      c = (double)(~-(ulong)(c < 0.0) & 0x3ff0000000000000 | -(ulong)(c < 0.0) & 0xbff0000000000000)
      ;
    }
  }
  else {
    d = (double)(~-(ulong)(x < 0.0) & 0x3ff0000000000000 | -(ulong)(x < 0.0) & 0xbff0000000000000);
  }
  if (ux != (double *)0x0) {
    *ux = d;
  }
  if (uy != (double *)0x0) {
    *uy = c;
  }
  return;
}

Assistant:

static void unitize2d( double x, double y, double* ux, double* uy )
{
  const double eps = 2.0*ON_SQRT_EPSILON;
  // carefully turn two numbers into a 2d unit vector
  double s, c, d;
  c = x;
  s = y;
  if ( s == 0.0 ) {
    c = (c < 0.0) ? -1.0 : 1.0;
  }
  else {
    if ( fabs(s) > fabs(c) ) {
      d = c/s;
      d = fabs(s)*sqrt(1.0+d*d);
    }
    else {
      d = s/c;
      d = fabs(c)*sqrt(1.0+d*d);
    }
    d = 1.0/d;
    if ( fabs(d-1.0) > eps ) {
      s *= d;
      c *= d;
    }
    if ( fabs(s) <= eps || fabs(c) >= 1.0-eps ) {
      s = 0.0;
      c = (c < 0.0) ? -1.0 : 1.0;
    }
    else if ( fabs(c) < eps || fabs(s) >= 1.0-eps) {
      c = 0.0;
      s = (s < 0.0) ? -1.0 : 1.0;
    }
  }
  if ( ux ) 
    *ux = c;
  if ( uy )
    *uy = s;
}